

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O2

void __thiscall
Plan::UnmarkDependents
          (Plan *this,Node *node,set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *dependents
          )

{
  iterator iVar1;
  pointer ppEVar2;
  pointer __v;
  pair<std::_Rb_tree_iterator<Node_*>,_bool> pVar3;
  Edge *edge;
  Edge *local_38;
  
  for (ppEVar2 = (node->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppEVar2 !=
      (node->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppEVar2 = ppEVar2 + 1) {
    local_38 = *ppEVar2;
    iVar1 = std::
            _Rb_tree<Edge_*,_std::pair<Edge_*const,_Plan::Want>,_std::_Select1st<std::pair<Edge_*const,_Plan::Want>_>,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
            ::find((_Rb_tree<Edge_*,_std::pair<Edge_*const,_Plan::Want>,_std::_Select1st<std::pair<Edge_*const,_Plan::Want>_>,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
                    *)this,&local_38);
    if (((_Rb_tree_header *)iVar1._M_node != &(this->want_)._M_t._M_impl.super__Rb_tree_header) &&
       (local_38->mark_ != VisitNone)) {
      local_38->mark_ = VisitNone;
      for (__v = (local_38->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
          __v != (local_38->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_finish; __v = __v + 1) {
        pVar3 = std::
                _Rb_tree<Node*,Node*,std::_Identity<Node*>,std::less<Node*>,std::allocator<Node*>>::
                _M_insert_unique<Node*const&>
                          ((_Rb_tree<Node*,Node*,std::_Identity<Node*>,std::less<Node*>,std::allocator<Node*>>
                            *)dependents,__v);
        if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          UnmarkDependents(this,*__v,dependents);
        }
      }
    }
  }
  return;
}

Assistant:

void Plan::UnmarkDependents(const Node* node, set<Node*>* dependents) {
  for (vector<Edge*>::const_iterator oe = node->out_edges().begin();
       oe != node->out_edges().end(); ++oe) {
    Edge* edge = *oe;

    map<Edge*, Want>::iterator want_e = want_.find(edge);
    if (want_e == want_.end())
      continue;

    if (edge->mark_ != Edge::VisitNone) {
      edge->mark_ = Edge::VisitNone;
      for (vector<Node*>::iterator o = edge->outputs_.begin();
           o != edge->outputs_.end(); ++o) {
        if (dependents->insert(*o).second)
          UnmarkDependents(*o, dependents);
      }
    }
  }
}